

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::Options(Options *this,int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  Options *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_oargv);
  std::__cxx11::string::string((string *)&this->m_commandString);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_argument);
  std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::vector
            (&this->m_optionRegister);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_optionList);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_extraArgv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_extraArgv_strings);
  this->m_oargc = -1;
  this->m_suppressQ = 0;
  this->m_processedQ = 0;
  this->m_optionsArgument = 0;
  this->m_options_error_check = 1;
  this->m_optionFlag = '-';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->m_extraArgv,100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->m_extraArgv_strings,100);
  setOptions(this,argc,argv);
  return;
}

Assistant:

Options::Options(int argc, char** argv) {
   m_oargc               = -1;
   m_suppressQ           =  0;
   m_processedQ          =  0;
   m_optionsArgument     =  0;
   m_options_error_check =  1;
   m_optionFlag          = '-';

   m_extraArgv.reserve(100);
   m_extraArgv_strings.reserve(100);

   setOptions(argc, argv);
}